

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

msgpack_unpack_return
msgpack_unpacker_next_with_size(msgpack_unpacker *mpac,msgpack_unpacked *result,size_t *p_bytes)

{
  void *pvVar1;
  msgpack_object *pmVar2;
  uint64_t uVar3;
  msgpack_unpack_return mVar4;
  msgpack_zone *pmVar5;
  
  if (result->zone != (msgpack_zone *)0x0) {
    msgpack_zone_free(result->zone);
    (result->data).via.u64 = 0;
    (result->data).via.array.ptr = (msgpack_object *)0x0;
    result->zone = (msgpack_zone *)0x0;
    *(undefined8 *)&result->data = 0;
  }
  mVar4 = msgpack_unpacker_execute(mpac);
  if (mVar4 < MSGPACK_UNPACK_CONTINUE) {
    (result->data).via.u64 = 0;
    (result->data).via.array.ptr = (msgpack_object *)0x0;
    result->zone = (msgpack_zone *)0x0;
    *(undefined8 *)&result->data = 0;
  }
  else if (mVar4 == MSGPACK_UNPACK_CONTINUE) {
    *p_bytes = mpac->parsed;
    mVar4 = MSGPACK_UNPACK_CONTINUE;
  }
  else {
    pmVar5 = msgpack_unpacker_release_zone(mpac);
    result->zone = pmVar5;
    pvVar1 = mpac->ctx;
    pmVar2 = *(msgpack_object **)((long)pvVar1 + 0x30);
    uVar3 = *(uint64_t *)((long)pvVar1 + 0x28);
    *(undefined8 *)&result->data = *(undefined8 *)((long)pvVar1 + 0x20);
    (result->data).via.u64 = uVar3;
    (result->data).via.array.ptr = pmVar2;
    *p_bytes = mpac->parsed;
    pvVar1 = mpac->ctx;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    *(undefined4 *)((long)pvVar1 + 0x18) = 0;
    *(undefined4 *)((long)pvVar1 + 0x20) = 0;
    mpac->parsed = 0;
    mVar4 = MSGPACK_UNPACK_SUCCESS;
  }
  return mVar4;
}

Assistant:

msgpack_unpack_return
msgpack_unpacker_next_with_size(msgpack_unpacker* mpac,
                                msgpack_unpacked* result, size_t *p_bytes)
{
    int ret;

    ret = unpacker_next(mpac, result);
    if (ret == MSGPACK_UNPACK_SUCCESS || ret == MSGPACK_UNPACK_CONTINUE) {
        *p_bytes = mpac->parsed;
    }

    if (ret == MSGPACK_UNPACK_SUCCESS) {
        msgpack_unpacker_reset(mpac);
    }

    return ret;
}